

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void maxPoolingInit(pBox *pbox,pBox *Matrix,int kernelSize,int stride,int flag)

{
  int iVar1;
  mydataFmt *pmVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = (float)stride;
  fVar3 = (float)(pbox->width - kernelSize) / fVar4 + 1.0;
  if (flag == 1) {
    fVar3 = floorf(fVar3);
    Matrix->width = (int)fVar3;
    fVar3 = floorf((float)(pbox->height - kernelSize) / fVar4 + 1.0);
  }
  else {
    fVar3 = ceilf(fVar3);
    Matrix->width = (int)fVar3;
    fVar3 = ceilf((float)(pbox->height - kernelSize) / fVar4 + 1.0);
  }
  Matrix->height = (int)fVar3;
  iVar1 = pbox->channel;
  Matrix->channel = iVar1;
  pmVar2 = (mydataFmt *)malloc((long)(int)fVar3 * (long)Matrix->width * (long)iVar1 * 4);
  Matrix->pdata = pmVar2;
  if (pmVar2 == (mydataFmt *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"the maxPoolingI nit is failed!!",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  memset(Matrix->pdata,0,(long)Matrix->height * (long)Matrix->width * (long)Matrix->channel * 4);
  return;
}

Assistant:

void maxPoolingInit(const pBox *pbox, pBox *Matrix, int kernelSize, int stride, int flag) {
    if (flag == 1) {
        Matrix->width = floor((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = floor((float) (pbox->height - kernelSize) / stride + 1);
    } else {
        Matrix->width = ceil((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = ceil((float) (pbox->height - kernelSize) / stride + 1);
    }
    Matrix->channel = pbox->channel;
    Matrix->pdata = (mydataFmt *) malloc(Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
    if (Matrix->pdata == NULL)cout << "the maxPoolingI nit is failed!!" << endl;
    memset(Matrix->pdata, 0, Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
}